

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O2

string * __thiscall
PDFObjectParser::MaybeDecryptString
          (string *__return_storage_ptr__,PDFObjectParser *this,string *inString)

{
  IPDFParserExtender *pIVar1;
  bool bVar2;
  string local_40 [32];
  
  if ((this->mDecryptionHelper != (DecryptionHelper *)0x0) &&
     (bVar2 = DecryptionHelper::IsEncrypted(this->mDecryptionHelper), bVar2)) {
    bVar2 = DecryptionHelper::CanDecryptDocument(this->mDecryptionHelper);
    if (bVar2) {
      DecryptionHelper::DecryptString(__return_storage_ptr__,this->mDecryptionHelper,inString);
      return __return_storage_ptr__;
    }
    pIVar1 = this->mParserExtender;
    if (pIVar1 != (IPDFParserExtender *)0x0) {
      std::__cxx11::string::string(local_40,(string *)inString);
      (**(code **)(*(long *)pIVar1 + 0x28))(__return_storage_ptr__,pIVar1,local_40);
      std::__cxx11::string::~string(local_40);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)inString);
  return __return_storage_ptr__;
}

Assistant:

std::string PDFObjectParser::MaybeDecryptString(const std::string& inString) {
	if (mDecryptionHelper && mDecryptionHelper->IsEncrypted()) {

		if (mDecryptionHelper->CanDecryptDocument())
			return mDecryptionHelper->DecryptString(inString);
		else {
			if (mParserExtender)
				return mParserExtender->DecryptString(inString);
			else
				return inString;
		}
	}
	else {
		return inString;
	}
}